

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::CopyImage::FunctionalTest::iterate(FunctionalTest *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  deUint32 err;
  GLuint GVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  reference test_case_00;
  TestContext *pTVar10;
  size_type sVar11;
  TestLog *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_210;
  Exception *exc;
  targetDesc desc;
  testCase *test_case;
  GLubyte *src_pixels [3];
  IterateResult local_34;
  bool result;
  IterateResult it_result;
  Functions *gl;
  GLubyte *dst_pixels [3];
  FunctionalTest *this_local;
  long lVar9;
  
  gl = (Functions *)0x0;
  dst_pixels[0] = (GLubyte *)0x0;
  dst_pixels[1] = (GLubyte *)0x0;
  dst_pixels[2] = (GLubyte *)this;
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  local_34 = STOP;
  test_case = (testCase *)0x0;
  src_pixels[0] = (GLubyte *)0x0;
  src_pixels[1] = (GLubyte *)0x0;
  test_case_00 = std::
                 vector<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
                 ::operator[](&this->m_test_cases,(ulong)this->m_test_case_index);
  (**(code **)(lVar9 + 0xff0))(0xd05);
  (**(code **)(lVar9 + 0xff0))(0xcf5,1);
  err = (**(code **)(lVar9 + 0x800))();
  glu::checkError(err,"PixelStorei",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xaa8);
  prepareDstPxls(this,&test_case_00->m_dst,(GLubyte **)&gl);
  prepareSrcPxls(this,&test_case_00->m_src,(test_case_00->m_dst).m_internal_format,
                 (GLubyte **)&test_case);
  GVar7 = prepareTexture(this,&test_case_00->m_dst,(GLubyte **)&gl,&this->m_dst_buf_name);
  this->m_dst_tex_name = GVar7;
  if ((test_case_00->m_src).m_target == 0x8d41) {
    uVar1 = (test_case_00->m_src).m_width;
    uVar2 = (test_case_00->m_src).m_height;
    uVar3 = (test_case_00->m_src).m_level;
    uVar4 = (test_case_00->m_src).m_internal_format;
    desc.m_level = (test_case_00->m_src).m_format;
    desc.m_internal_format = (test_case_00->m_src).m_type;
    exc = (Exception *)CONCAT44(uVar1,0xde1);
    desc.m_target = uVar2;
    desc.m_width = uVar3;
    desc.m_height = uVar4;
    GVar7 = prepareTexture(this,&test_case_00->m_src,(GLubyte **)&test_case,&this->m_src_buf_name);
    this->m_rb_name = GVar7;
    GVar7 = prepareTexture(this,(targetDesc *)&exc,(GLubyte **)&test_case,&this->m_src_buf_name);
    this->m_src_tex_name = GVar7;
  }
  else {
    GVar7 = prepareTexture(this,&test_case_00->m_src,(GLubyte **)&test_case,&this->m_src_buf_name);
    this->m_src_tex_name = GVar7;
  }
  bVar5 = copyAndVerify(this,test_case_00,(GLubyte **)&gl,(GLubyte **)&test_case);
  clean(this);
  cleanPixels(this,(GLubyte **)&gl);
  cleanPixels(this,(GLubyte **)&test_case);
  if (bVar5) {
    pTVar10 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar10,QP_TEST_RESULT_PASS,"Pass");
    this->m_test_case_index = this->m_test_case_index + 1;
    sVar11 = std::
             vector<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
             ::size(&this->m_test_cases);
    local_34 = (IterateResult)(this->m_test_case_index < sVar11);
  }
  else {
    pTVar10 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_00 = tcu::TestContext::getLog(pTVar10);
    tcu::TestLog::operator<<(&local_210,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<(&local_210,(char (*) [10])"Failure. ");
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_210);
    pTVar10 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar10,QP_TEST_RESULT_FAIL,"Fail");
  }
  return local_34;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	GLubyte*					 dst_pixels[FUNCTIONAL_TEST_N_LEVELS] = { 0 };
	const Functions&			 gl									  = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result							  = tcu::TestNode::STOP;
	bool						 result								  = false;
	GLubyte*					 src_pixels[FUNCTIONAL_TEST_N_LEVELS] = { 0 };
	const testCase&				 test_case							  = m_test_cases[m_test_case_index];

	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "PixelStorei");

	try
	{
		/* Prepare pixels */
		prepareDstPxls(test_case.m_dst, dst_pixels);
		prepareSrcPxls(test_case.m_src, test_case.m_dst.m_internal_format, src_pixels);

		/* Prepare textures */
		m_dst_tex_name = prepareTexture(test_case.m_dst, (const GLubyte**)dst_pixels, m_dst_buf_name);

		if (GL_RENDERBUFFER == test_case.m_src.m_target)
		{
			targetDesc desc = test_case.m_src;
			desc.m_target   = GL_TEXTURE_2D;

			m_rb_name	  = prepareTexture(test_case.m_src, (const GLubyte**)src_pixels, m_src_buf_name);
			m_src_tex_name = prepareTexture(desc, (const GLubyte**)src_pixels, m_src_buf_name);
		}
		else
		{
			m_src_tex_name = prepareTexture(test_case.m_src, (const GLubyte**)src_pixels, m_src_buf_name);
		}

		/* Copy images and verify results */
		result = copyAndVerify(test_case, (const GLubyte**)dst_pixels, (const GLubyte**)src_pixels);
	}
	catch (tcu::Exception& exc)
	{
		clean();
		cleanPixels((GLubyte**)dst_pixels);
		cleanPixels((GLubyte**)src_pixels);
		throw exc;
	}

	/* Free resources */
	clean();
	cleanPixels((GLubyte**)dst_pixels);
	cleanPixels((GLubyte**)src_pixels);

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Failure. " << tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}